

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserSamTest_ParseWhole_Test::TestBody(BioparserSamTest_ParseWhole_Test *this)

{
  pointer pPVar1;
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  local_60;
  allocator local_31;
  string local_30;
  BioparserSamTest_ParseWhole_Test *local_10;
  BioparserSamTest_ParseWhole_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"sample.sam",&local_31);
  BioparserSamTest::Setup(&this->super_BioparserSamTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pPVar1 = std::
           unique_ptr<bioparser::Parser<bioparser::test::SamOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
           ::operator->(&(this->super_BioparserSamTest).p);
  (*pPVar1->_vptr_Parser[2])(&local_60,pPVar1,0xffffffffffffffff,1);
  std::
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  ::operator=(&(this->super_BioparserSamTest).o,&local_60);
  std::
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  ::~vector(&local_60);
  BioparserSamTest::Check(&this->super_BioparserSamTest);
  return;
}

Assistant:

TEST_F(BioparserSamTest, ParseWhole) {
  Setup("sample.sam");
  o = p->Parse(-1);
  Check();
}